

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageIO.cpp
# Opt level: O1

void Imf_3_4::loadDeepImage(string *fileName,Header *hdr,DeepImage *img)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  string *psVar4;
  ostream *poVar5;
  ArgExc *pAVar6;
  bool tiled;
  bool multiPart;
  bool deep;
  stringstream _iex_throw_s;
  bool local_1b3;
  bool local_1b2;
  bool local_1b1;
  MultiPartInputFile local_1b0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a8;
  ostream local_1a0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_198;
  
  cVar2 = Imf_3_4::isOpenExrFile((fileName->_M_dataplus)._M_p,&local_1b3,&local_1b1,&local_1b2);
  if (cVar2 == '\0') {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Cannot load image file ",0x17);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a0,(fileName->_M_dataplus)._M_p,fileName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,".  The file is not an OpenEXR file.",0x23);
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar6,(stringstream *)local_1b0);
    __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  if (local_1b2 == true) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Cannot load image file ",0x17);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a0,(fileName->_M_dataplus)._M_p,fileName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,".  Multi-part file loading is not supported.",0x2c);
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar6,(stringstream *)local_1b0);
    __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  if (local_1b1 == false) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"Cannot load flat image file ",0x1c);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a0,(fileName->_M_dataplus)._M_p,fileName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," as a deep image.",0x11);
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar6,(stringstream *)local_1b0);
    __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pcVar1 = (fileName->_M_dataplus)._M_p;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(local_1b0,pcVar1,iVar3,true);
  iVar3 = Imf_3_4::MultiPartInputFile::parts();
  if (0 < iVar3) {
    Imf_3_4::MultiPartInputFile::header((int)local_1b0);
    cVar2 = Imf_3_4::Header::hasType();
    if (cVar2 != '\0') {
      Imf_3_4::MultiPartInputFile::header((int)local_1b0);
      psVar4 = (string *)Imf_3_4::Header::type_abi_cxx11_();
      local_1b3 = (bool)Imf_3_4::isTiled(psVar4);
      goto LAB_00117c61;
    }
  }
  local_1b3 = false;
LAB_00117c61:
  if (local_198 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198);
  }
  if (local_1a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8);
  }
  if (local_1b3 == true) {
    loadDeepTiledImage(fileName,hdr,img);
  }
  else {
    loadDeepScanLineImage(fileName,hdr,img);
  }
  return;
}

Assistant:

void
loadDeepImage (const string& fileName, Header& hdr, DeepImage& img)
{
    bool tiled, deep, multiPart;

    if (!isOpenExrFile (fileName.c_str (), tiled, deep, multiPart))
    {
        THROW (
            ArgExc,
            "Cannot load image file " << fileName
                                      << ".  "
                                         "The file is not an OpenEXR file.");
    }

    if (multiPart)
    {
        THROW (
            ArgExc,
            "Cannot load image file "
                << fileName
                << ".  "
                   "Multi-part file loading is not supported.");
    }

    if (!deep)
    {
        THROW (
            ArgExc,
            "Cannot load flat image file " << fileName
                                           << " "
                                              "as a deep image.");
    }

    //XXX TODO: the tiled flag obtained above is unreliable;
    // open the file as a multi-part file and inspect the header.
    // Can the OpenEXR library be fixed?

    {
        MultiPartInputFile mpi (fileName.c_str ());

        tiled =
            (mpi.parts () > 0 && mpi.header (0).hasType () &&
             isTiled (mpi.header (0).type ()));
    }

    if (tiled)
        loadDeepTiledImage (fileName, hdr, img);
    else
        loadDeepScanLineImage (fileName, hdr, img);
}